

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  size_t i;
  long lVar1;
  int iVar2;
  int a [4];
  
  for (lVar1 = 1; lVar1 != 5; lVar1 = lVar1 + 1) {
    printf("%lu-th number: ",lVar1);
    __isoc99_scanf("%d");
  }
  iVar2 = 0;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    if (iVar2 < a[lVar1]) {
      iVar2 = a[lVar1];
    }
  }
  printf("The biggest number is %d.\n");
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  int a[N_INT];

  for (size_t i = 0; i < N_INT; i++) {
    printf("%lu-th number: ", i + 1);
    scanf("%d", &a[i]);
  }

  int max = 0;
  for (size_t i = 0; i < N_INT; i++) {
    if (a[i] > max) max = a[i];
  }

  printf("The biggest number is %d.\n", max);

  return 0;
}